

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsGetScalarTypeFromName(char *name,FmsScalarType *type)

{
  int iVar1;
  FmsScalarType FVar2;
  
  if (name == (char *)0x0) {
    return 1;
  }
  if (type == (FmsScalarType *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = strcmp("FMS_FLOAT",name);
    FVar2 = FMS_FLOAT;
    if (iVar1 != 0) {
      iVar1 = strcmp("FMS_DOUBLE",name);
      if (iVar1 == 0) {
        FVar2 = FMS_DOUBLE;
      }
      else {
        iVar1 = strcmp("FMS_COMPLEX_FLOAT",name);
        if (iVar1 == 0) {
          FVar2 = FMS_COMPLEX_FLOAT;
        }
        else {
          iVar1 = strcmp("FMS_COMPLEX_DOUBLE",name);
          FVar2 = FMS_COMPLEX_DOUBLE;
          if (iVar1 != 0) {
            return 3;
          }
        }
      }
    }
    *type = FVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int FmsGetScalarTypeFromName(const char * const name, FmsScalarType *type) {
  if(!name) E_RETURN(1);
  if(!type) E_RETURN(2);

  if(strcmp(FmsScalarTypeNames[FMS_FLOAT], name) == 0)
    *type = FMS_FLOAT;
  else if(strcmp(FmsScalarTypeNames[FMS_DOUBLE], name) == 0)
    *type = FMS_DOUBLE;
  else if(strcmp(FmsScalarTypeNames[FMS_COMPLEX_FLOAT], name) == 0)
    *type = FMS_COMPLEX_FLOAT;
  else if(strcmp(FmsScalarTypeNames[FMS_COMPLEX_DOUBLE], name) == 0)
    *type = FMS_COMPLEX_DOUBLE;
  else
    E_RETURN(3);

  return 0;
}